

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

LY_ERR lysp_type_dup(ly_ctx *ctx,lysp_module *pmod,lysp_type *orig_type,lysp_type *type)

{
  lysp_ext_instance **pplVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  lysp_restr *plVar4;
  lysp_type_enum *plVar5;
  lysp_type_enum *plVar6;
  char **ppcVar7;
  char **ppcVar8;
  char **ppcVar9;
  lysp_type *plVar10;
  lysp_type *plVar11;
  lysc_type *plVar12;
  LY_ERR LVar13;
  lysp_restr *plVar14;
  long *plVar15;
  lysp_ext_instance *plVar16;
  ulong uVar17;
  lysp_ext_instance *plVar18;
  long lVar19;
  char *pcVar20;
  lysp_ext_instance *plVar21;
  size_t sVar22;
  lysp_ext_instance *plVar23;
  char *pcVar24;
  ulong uVar25;
  long lVar26;
  
  type->pmod = (lysp_module *)0x0;
  type->compiled = (lysc_type *)0x0;
  type->types = (lysp_type *)0x0;
  type->exts = (lysp_ext_instance *)0x0;
  type->path = (lyxp_expr *)0x0;
  type->bases = (char **)0x0;
  type->enums = (lysp_type_enum *)0x0;
  type->bits = (lysp_type_enum *)0x0;
  type->length = (lysp_restr *)0x0;
  type->patterns = (lysp_restr *)0x0;
  type->name = (char *)0x0;
  type->range = (lysp_restr *)0x0;
  type->fraction_digits = '\0';
  type->require_instance = '\0';
  type->flags = 0;
  *(undefined4 *)&type->field_0x64 = 0;
  LVar13 = lydict_dup(ctx,orig_type->name,&type->name);
  if (LVar13 != LY_SUCCESS) {
    return LVar13;
  }
  if (orig_type->range != (lysp_restr *)0x0) {
    plVar14 = (lysp_restr *)calloc(1,0x40);
    type->range = plVar14;
    if (plVar14 == (lysp_restr *)0x0) goto LAB_0014f5e9;
    LVar13 = lysp_restr_dup(ctx,pmod,orig_type->range,plVar14);
    if (LVar13 != LY_SUCCESS) {
      return LVar13;
    }
  }
  if (orig_type->length != (lysp_restr *)0x0) {
    plVar14 = (lysp_restr *)calloc(1,0x40);
    type->length = plVar14;
    if (plVar14 == (lysp_restr *)0x0) goto LAB_0014f5e9;
    LVar13 = lysp_restr_dup(ctx,pmod,orig_type->length,plVar14);
    if (LVar13 != LY_SUCCESS) {
      return LVar13;
    }
  }
  plVar14 = orig_type->patterns;
  if (plVar14 != (lysp_restr *)0x0) {
    plVar4 = type->patterns;
    if (plVar4 == (lysp_restr *)0x0) {
      plVar15 = (long *)calloc(1,(long)plVar14[-1].exts << 6 | 8);
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = 0;
    }
    else {
      plVar15 = (long *)realloc(&plVar4[-1].exts,
                                ((long)&(plVar4[-1].exts)->name + (long)&(plVar14[-1].exts)->name) *
                                0x40 | 8);
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = *plVar15;
    }
    type->patterns = (lysp_restr *)(plVar15 + 1);
    if (orig_type->patterns == (lysp_restr *)0x0) {
      sVar22 = 0;
    }
    else {
      sVar22 = (long)orig_type->patterns[-1].exts << 6;
    }
    plVar21 = (lysp_ext_instance *)0xffffffffffffffff;
    memset(plVar15 + lVar19 * 8 + 1,0,sVar22);
    lVar19 = 0;
    while( true ) {
      plVar14 = orig_type->patterns;
      if (plVar14 == (lysp_restr *)0x0) {
        plVar16 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar16 = plVar14[-1].exts;
      }
      plVar21 = (lysp_ext_instance *)((long)&plVar21->name + 1);
      if (plVar16 <= plVar21) break;
      plVar4 = type->patterns;
      pplVar1 = &plVar4[-1].exts;
      *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)->name + 1);
      LVar13 = lysp_restr_dup(ctx,pmod,(lysp_restr *)((long)&(plVar14->arg).str + lVar19),
                              (lysp_restr *)((long)&(plVar4->arg).str + lVar19));
      lVar19 = lVar19 + 0x40;
      if (LVar13 != LY_SUCCESS) {
        return LVar13;
      }
    }
  }
  plVar5 = orig_type->enums;
  if (plVar5 != (lysp_type_enum *)0x0) {
    plVar6 = type->enums;
    if (plVar6 == (lysp_type_enum *)0x0) {
      plVar15 = (long *)calloc(1,*(long *)&plVar5[-1].flags * 0x38 + 8);
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = 0;
    }
    else {
      plVar15 = (long *)realloc(&plVar6[-1].flags,
                                (*(long *)&plVar5[-1].flags + *(long *)&plVar6[-1].flags) * 0x38 + 8
                               );
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = *plVar15;
    }
    type->enums = (lysp_type_enum *)(plVar15 + 1);
    if (orig_type->enums == (lysp_type_enum *)0x0) {
      sVar22 = 0;
    }
    else {
      sVar22 = *(long *)&orig_type->enums[-1].flags * 0x38;
    }
    memset(plVar15 + lVar19 * 7 + 1,0,sVar22);
    uVar25 = 0xffffffffffffffff;
    lVar19 = 0;
    while( true ) {
      plVar5 = orig_type->enums;
      if (plVar5 == (lysp_type_enum *)0x0) {
        uVar17 = 0;
      }
      else {
        uVar17 = *(ulong *)&plVar5[-1].flags;
      }
      uVar25 = uVar25 + 1;
      if (uVar17 <= uVar25) break;
      plVar6 = type->enums;
      puVar2 = &plVar6[-1].flags;
      *(long *)puVar2 = *(long *)puVar2 + 1;
      LVar13 = lysp_type_enum_dup(ctx,pmod,(lysp_type_enum *)((long)&plVar5->name + lVar19),
                                  (lysp_type_enum *)((long)&plVar6->name + lVar19));
      lVar19 = lVar19 + 0x38;
      if (LVar13 != LY_SUCCESS) {
        return LVar13;
      }
    }
  }
  plVar5 = orig_type->bits;
  if (plVar5 != (lysp_type_enum *)0x0) {
    plVar6 = type->bits;
    if (plVar6 == (lysp_type_enum *)0x0) {
      plVar15 = (long *)calloc(1,*(long *)&plVar5[-1].flags * 0x38 + 8);
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = 0;
    }
    else {
      plVar15 = (long *)realloc(&plVar6[-1].flags,
                                (*(long *)&plVar5[-1].flags + *(long *)&plVar6[-1].flags) * 0x38 + 8
                               );
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = *plVar15;
    }
    type->bits = (lysp_type_enum *)(plVar15 + 1);
    if (orig_type->bits == (lysp_type_enum *)0x0) {
      sVar22 = 0;
    }
    else {
      sVar22 = *(long *)&orig_type->bits[-1].flags * 0x38;
    }
    memset(plVar15 + lVar19 * 7 + 1,0,sVar22);
    uVar25 = 0xffffffffffffffff;
    lVar19 = 0;
    while( true ) {
      plVar5 = orig_type->bits;
      if (plVar5 == (lysp_type_enum *)0x0) {
        uVar17 = 0;
      }
      else {
        uVar17 = *(ulong *)&plVar5[-1].flags;
      }
      uVar25 = uVar25 + 1;
      if (uVar17 <= uVar25) break;
      plVar6 = type->bits;
      puVar2 = &plVar6[-1].flags;
      *(long *)puVar2 = *(long *)puVar2 + 1;
      LVar13 = lysp_type_enum_dup(ctx,pmod,(lysp_type_enum *)((long)&plVar5->name + lVar19),
                                  (lysp_type_enum *)((long)&plVar6->name + lVar19));
      lVar19 = lVar19 + 0x38;
      if (LVar13 != LY_SUCCESS) {
        return LVar13;
      }
    }
  }
  LVar13 = lyxp_expr_dup(ctx,orig_type->path,0,0,&type->path);
  if (LVar13 != LY_SUCCESS) {
    return LVar13;
  }
  ppcVar7 = orig_type->bases;
  if (ppcVar7 != (char **)0x0) {
    ppcVar8 = type->bases;
    if (ppcVar8 == (char **)0x0) {
      plVar15 = (long *)calloc(1,(long)ppcVar7[-1] * 8 + 8);
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = 0;
    }
    else {
      plVar15 = (long *)realloc(ppcVar8 + -1,(long)(ppcVar7[-1] + (long)ppcVar8[-1]) * 8 + 8);
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = *plVar15;
    }
    type->bases = (char **)(plVar15 + 1);
    if (orig_type->bases == (char **)0x0) {
      sVar22 = 0;
    }
    else {
      sVar22 = (long)orig_type->bases[-1] << 3;
    }
    lVar26 = 0;
    memset(plVar15 + lVar19 + 1,0,sVar22);
    pcVar24 = (char *)0x0;
    while( true ) {
      ppcVar7 = orig_type->bases;
      if (ppcVar7 == (char **)0x0) {
        pcVar20 = (char *)0x0;
      }
      else {
        pcVar20 = ppcVar7[-1];
      }
      if (pcVar20 <= pcVar24) break;
      ppcVar9 = type->bases;
      ppcVar8 = ppcVar9 + -1;
      *ppcVar8 = *ppcVar8 + 1;
      LVar13 = lydict_dup(ctx,*(char **)((long)ppcVar7 + lVar26),(char **)((long)ppcVar9 + lVar26));
      pcVar24 = pcVar24 + 1;
      lVar26 = lVar26 + 8;
      if (LVar13 != LY_SUCCESS) {
        return LVar13;
      }
    }
  }
  plVar10 = orig_type->types;
  if (plVar10 != (lysp_type *)0x0) {
    plVar11 = type->types;
    if (plVar11 == (lysp_type *)0x0) {
      plVar15 = (long *)calloc(1,*(long *)&plVar10[-1].fraction_digits * 0x68 + 8);
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = 0;
    }
    else {
      plVar15 = (long *)realloc(&plVar11[-1].fraction_digits,
                                (*(long *)&plVar10[-1].fraction_digits +
                                *(long *)&plVar11[-1].fraction_digits) * 0x68 + 8);
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = *plVar15;
    }
    type->types = (lysp_type *)(plVar15 + 1);
    if (orig_type->types == (lysp_type *)0x0) {
      sVar22 = 0;
    }
    else {
      sVar22 = *(long *)&orig_type->types[-1].fraction_digits * 0x68;
    }
    memset(plVar15 + lVar19 * 0xd + 1,0,sVar22);
    uVar25 = 0xffffffffffffffff;
    lVar19 = 0;
    while( true ) {
      plVar10 = orig_type->types;
      if (plVar10 == (lysp_type *)0x0) {
        uVar17 = 0;
      }
      else {
        uVar17._0_1_ = plVar10[-1].fraction_digits;
        uVar17._1_1_ = plVar10[-1].require_instance;
        uVar17._2_2_ = plVar10[-1].flags;
        uVar17._4_4_ = *(undefined4 *)&plVar10[-1].field_0x64;
      }
      uVar25 = uVar25 + 1;
      if (uVar17 <= uVar25) break;
      plVar11 = type->types;
      puVar3 = &plVar11[-1].fraction_digits;
      *(long *)puVar3 = *(long *)puVar3 + 1;
      LVar13 = lysp_type_dup(ctx,pmod,(lysp_type *)((long)&plVar10->name + lVar19),
                             (lysp_type *)((long)&plVar11->name + lVar19));
      lVar19 = lVar19 + 0x68;
      if (LVar13 != LY_SUCCESS) {
        return LVar13;
      }
    }
  }
  plVar21 = orig_type->exts;
  if (plVar21 != (lysp_ext_instance *)0x0) {
    plVar16 = type->exts;
    if (plVar16 == (lysp_ext_instance *)0x0) {
      plVar15 = (long *)calloc(1,(long)plVar21[-1].exts * 0x70 | 8);
      if (plVar15 == (long *)0x0) goto LAB_0014f5e9;
      lVar19 = 0;
      plVar23 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar23 = plVar16[-1].exts;
      plVar15 = (long *)realloc(&plVar16[-1].exts,
                                ((long)&plVar23->name + (long)&(plVar21[-1].exts)->name) * 0x70 | 8)
      ;
      if (plVar15 == (long *)0x0) {
LAB_0014f5e9:
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
        return LY_EMEM;
      }
      lVar19 = *plVar15;
    }
    type->exts = (lysp_ext_instance *)(plVar15 + 1);
    if (orig_type->exts == (lysp_ext_instance *)0x0) {
      sVar22 = 0;
    }
    else {
      sVar22 = (long)orig_type->exts[-1].exts * 0x70;
    }
    memset(plVar15 + lVar19 * 0xe + 1,0,sVar22);
    plVar21 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar19 = 0;
    while( true ) {
      plVar16 = orig_type->exts;
      if (plVar16 == (lysp_ext_instance *)0x0) {
        plVar18 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar18 = plVar16[-1].exts;
      }
      plVar21 = (lysp_ext_instance *)((long)&plVar21->name + 1);
      if (plVar18 <= plVar21) break;
      plVar18 = type->exts;
      pplVar1 = &plVar18[-1].exts;
      *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)->name + 1);
      LVar13 = lysp_ext_dup(ctx,pmod,type,LY_STMT_TYPE,
                            (lysp_ext_instance *)((long)&plVar16->name + lVar19),
                            (lysp_ext_instance *)((long)&plVar18[(long)plVar23].name + lVar19));
      lVar19 = lVar19 + 0x70;
      if (LVar13 != LY_SUCCESS) {
        return LVar13;
      }
    }
  }
  plVar12 = orig_type->compiled;
  type->pmod = orig_type->pmod;
  type->compiled = plVar12;
  type->fraction_digits = orig_type->fraction_digits;
  type->require_instance = orig_type->require_instance;
  type->flags = orig_type->flags;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lysp_type_dup(const struct ly_ctx *ctx, const struct lysp_module *pmod, const struct lysp_type *orig_type,
        struct lysp_type *type)
{
    LY_ERR ret = LY_SUCCESS;

    /* array macros read previous data so we must zero it */
    memset(type, 0, sizeof *type);

    DUP_STRING_GOTO(ctx, orig_type->name, type->name, ret, done);

    if (orig_type->range) {
        type->range = calloc(1, sizeof *type->range);
        LY_CHECK_ERR_RET(!type->range, LOGMEM(ctx), LY_EMEM);
        LY_CHECK_RET(lysp_restr_dup(ctx, pmod, orig_type->range, type->range));
    }

    if (orig_type->length) {
        type->length = calloc(1, sizeof *type->length);
        LY_CHECK_ERR_RET(!type->length, LOGMEM(ctx), LY_EMEM);
        LY_CHECK_RET(lysp_restr_dup(ctx, pmod, orig_type->length, type->length));
    }

    DUP_ARRAY2(ctx, pmod, orig_type->patterns, type->patterns, lysp_restr_dup);
    DUP_ARRAY2(ctx, pmod, orig_type->enums, type->enums, lysp_type_enum_dup);
    DUP_ARRAY2(ctx, pmod, orig_type->bits, type->bits, lysp_type_enum_dup);
    LY_CHECK_GOTO(ret = lyxp_expr_dup(ctx, orig_type->path, 0, 0, &type->path), done);
    DUP_ARRAY(ctx, orig_type->bases, type->bases, lysp_string_dup);
    DUP_ARRAY2(ctx, pmod, orig_type->types, type->types, lysp_type_dup);
    DUP_EXTS(ctx, pmod, type, LY_STMT_TYPE, orig_type->exts, type->exts, lysp_ext_dup);

    type->pmod = orig_type->pmod;
    type->compiled = orig_type->compiled;

    type->fraction_digits = orig_type->fraction_digits;
    type->require_instance = orig_type->require_instance;
    type->flags = orig_type->flags;

done:
    return ret;
}